

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O2

int32_t __thiscall
icu_63::Calendar::getActualMaximum(Calendar *this,UCalendarDateFields field,UErrorCode *status)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int endValue;
  int32_t iVar4;
  Calendar *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var;
  
  if (field < UCAL_IS_LEAP_MONTH) {
    if ((0x35fe80U >> (field & (UCAL_DST_OFFSET|UCAL_ZONE_OFFSET)) & 1) != 0) {
      iVar1 = (*(this->super_UObject)._vptr_UObject[0x10])(this,field);
      return iVar1;
    }
    if (field == UCAL_DATE) {
      if (U_ZERO_ERROR < *status) {
        return 0;
      }
      iVar1 = (*(this->super_UObject)._vptr_UObject[3])(this);
      this_00 = (Calendar *)CONCAT44(extraout_var_00,iVar1);
      if (this_00 != (Calendar *)0x0) {
        this_00->fLenient = '\x01';
        (*(this_00->super_UObject)._vptr_UObject[0x1e])(this_00,5,0,status);
        uVar2 = get(this_00,UCAL_EXTENDED_YEAR,status);
        uVar3 = get(this_00,UCAL_MONTH,status);
        iVar1 = (*(this->super_UObject)._vptr_UObject[0x22])(this,(ulong)uVar2,(ulong)uVar3);
LAB_001f3435:
        (*(this_00->super_UObject)._vptr_UObject[1])(this_00);
        return iVar1;
      }
    }
    else {
      if (field != UCAL_DAY_OF_YEAR) goto LAB_001f3444;
      if (U_ZERO_ERROR < *status) {
        return 0;
      }
      iVar1 = (*(this->super_UObject)._vptr_UObject[3])(this);
      this_00 = (Calendar *)CONCAT44(extraout_var,iVar1);
      if (this_00 != (Calendar *)0x0) {
        this_00->fLenient = '\x01';
        (*(this_00->super_UObject)._vptr_UObject[0x1e])(this_00,6,0,status);
        uVar2 = get(this_00,UCAL_EXTENDED_YEAR,status);
        iVar1 = (*(this->super_UObject)._vptr_UObject[0x23])(this,(ulong)uVar2);
        goto LAB_001f3435;
      }
    }
    *status = U_MEMORY_ALLOCATION_ERROR;
    return 0;
  }
LAB_001f3444:
  iVar1 = (*(this->super_UObject)._vptr_UObject[0x14])(this,field);
  endValue = (*(this->super_UObject)._vptr_UObject[0x10])(this,field);
  iVar4 = getActualHelper(this,field,iVar1,endValue,status);
  return iVar4;
}

Assistant:

int32_t
Calendar::getActualMaximum(UCalendarDateFields field, UErrorCode& status) const
{
    int32_t result;
    switch (field) {
    case UCAL_DATE:
        {
            if(U_FAILURE(status)) return 0;
            Calendar *cal = clone();
            if(!cal) { status = U_MEMORY_ALLOCATION_ERROR; return 0; }
            cal->setLenient(TRUE);
            cal->prepareGetActual(field,FALSE,status);
            result = handleGetMonthLength(cal->get(UCAL_EXTENDED_YEAR, status), cal->get(UCAL_MONTH, status));
            delete cal;
        }
        break;

    case UCAL_DAY_OF_YEAR:
        {
            if(U_FAILURE(status)) return 0;
            Calendar *cal = clone();
            if(!cal) { status = U_MEMORY_ALLOCATION_ERROR; return 0; }
            cal->setLenient(TRUE);
            cal->prepareGetActual(field,FALSE,status);
            result = handleGetYearLength(cal->get(UCAL_EXTENDED_YEAR, status));
            delete cal;
        }
        break;

    case UCAL_DAY_OF_WEEK:
    case UCAL_AM_PM:
    case UCAL_HOUR:
    case UCAL_HOUR_OF_DAY:
    case UCAL_MINUTE:
    case UCAL_SECOND:
    case UCAL_MILLISECOND:
    case UCAL_ZONE_OFFSET:
    case UCAL_DST_OFFSET:
    case UCAL_DOW_LOCAL:
    case UCAL_JULIAN_DAY:
    case UCAL_MILLISECONDS_IN_DAY:
        // These fields all have fixed minima/maxima
        result = getMaximum(field);
        break;

    default:
        // For all other fields, do it the hard way....
        result = getActualHelper(field, getLeastMaximum(field), getMaximum(field),status);
        break;
    }
    return result;
}